

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

void update_topbar(game_event_type type,game_event_data *data,void *user,wchar_t row)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t col;
  wchar_t row_local;
  void *user_local;
  game_event_data *data_local;
  game_event_type type_local;
  
  prt("",row,L'\0');
  wVar1 = prt_level_short(row,L'\0');
  wVar2 = prt_exp_short(row,wVar1);
  wVar3 = prt_stat_short(L'\0',row,wVar2 + wVar1);
  wVar3 = wVar3 + wVar2 + wVar1;
  wVar1 = prt_stat_short(L'\x01',row,wVar3);
  wVar1 = wVar1 + wVar3;
  wVar2 = prt_stat_short(L'\x02',row,wVar1);
  wVar2 = wVar2 + wVar1;
  wVar1 = prt_stat_short(L'\x03',row,wVar2);
  wVar1 = wVar1 + wVar2;
  wVar2 = prt_stat_short(L'\x04',row,wVar1);
  wVar2 = wVar2 + wVar1;
  wVar1 = prt_ac_short(row,wVar2);
  wVar1 = wVar1 + wVar2;
  wVar2 = prt_gold_short(row,wVar1);
  prt_race_class_short(row,wVar2 + wVar1);
  wVar1 = row + L'\x01';
  prt("",wVar1,L'\0');
  wVar2 = prt_hp_short(wVar1,L'\0');
  wVar3 = prt_sp_short(wVar1,wVar2);
  wVar4 = prt_health_short(wVar1,wVar3 + wVar2);
  wVar4 = wVar4 + wVar3 + wVar2;
  wVar2 = prt_speed_short(wVar1,wVar4);
  wVar2 = wVar2 + wVar4;
  wVar3 = prt_depth_short(wVar1,wVar2);
  prt_title_short(wVar1,wVar3 + wVar2);
  return;
}

Assistant:

static void update_topbar(game_event_type type, game_event_data *data,
						  void *user, int row)
{	
	int col = 0;	

	prt("", row, col);	

	col += prt_level_short(row, col);

	col += prt_exp_short(row, col);
	
	col += prt_stat_short(STAT_STR, row, col);
	col += prt_stat_short(STAT_INT, row, col);
	col += prt_stat_short(STAT_WIS, row, col);
	col += prt_stat_short(STAT_DEX, row, col);
	col += prt_stat_short(STAT_CON, row, col);

	col += prt_ac_short(row, col);

	col += prt_gold_short(row, col);

	col += prt_race_class_short(row, col);

	++row;
	col = 0;

	prt("", row, col);

	col += prt_hp_short(row, col);
	col += prt_sp_short(row, col);
	col += prt_health_short(row, col);	
	col += prt_speed_short(row, col);
	col += prt_depth_short(row, col);
	col += prt_title_short(row, col);
}